

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32_t res)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  
  pcVar1 = p + 2;
  lVar2 = -0x1c;
  do {
    res = ((byte)pcVar1[-1] - 1 << ((char)lVar2 + 0x23U & 0x1f)) + res;
    if (-1 < pcVar1[-1]) goto LAB_002ef98a;
    pcVar1 = pcVar1 + 1;
    lVar2 = lVar2 + 7;
  } while (lVar2 != 0);
  lVar2 = 5;
  uVar3 = 0;
  pcVar4 = p + 6;
  do {
    pcVar1 = pcVar4;
    if (-1 < pcVar1[-1]) goto LAB_002ef98a;
    pcVar4 = pcVar1 + 1;
    pcVar1 = (char *)0x0;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
LAB_002ef98c:
  pVar5._8_8_ = uVar3;
  pVar5.first = pcVar1;
  return pVar5;
LAB_002ef98a:
  uVar3 = (ulong)res;
  goto LAB_002ef98c;
}

Assistant:

std::pair<const char*, uint32_t> VarintParseSlow32(const char* p,
                                                   uint32_t res) {
  for (std::uint32_t i = 1; i < 5; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}